

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

string * __thiscall
spvtools::val::ValidationState_t::Disassemble_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,Instruction *inst)

{
  undefined4 in_stack_ffffffffffffffec;
  uint32_t in_stack_fffffffffffffff0;
  
  spvInstructionBinaryToText_abi_cxx11_
            (__return_storage_ptr__,(spvtools *)(ulong)this->context_->target_env,
             (spv_target_env)(inst->inst_).words,(uint32_t *)(ulong)(inst->inst_).num_words,
             (size_t)this->words_,(uint32_t *)this->num_words_,
             CONCAT44(in_stack_ffffffffffffffec,0x60),in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string ValidationState_t::Disassemble(const Instruction& inst) const {
  const spv_parsed_instruction_t& c_inst(inst.c_inst());
  return Disassemble(c_inst.words, c_inst.num_words);
}